

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::DebugNodeWindow(ImGuiWindow *window,char *label)

{
  bool bVar1;
  ImVec4 *col;
  char *pcVar2;
  ImDrawList *pIVar3;
  ImGuiOldColumns *columns;
  char *pcVar4;
  char *pcVar5;
  ImVec2 *lhs;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcVar10;
  char *pcVar11;
  char *local_b0;
  uint local_98;
  int local_78;
  ImVec2 IStack_74;
  int n;
  ImVec2 local_6c;
  ImVec2 local_64;
  ImRect r;
  int layer;
  ImGuiWindowFlags flags;
  byte local_41;
  uint local_40;
  bool open;
  ImGuiTreeNodeFlags tree_node_flags;
  bool is_active;
  ImGuiContext *g;
  char *label_local;
  ImGuiWindow *window_local;
  
  g = (ImGuiContext *)label;
  label_local = (char *)window;
  if (window == (ImGuiWindow *)0x0) {
    BulletText("%s: NULL",label);
  }
  else {
    _tree_node_flags = GImGui;
    open = (bool)(window->WasActive & 1);
    local_40 = (uint)(window == GImGui->NavWindow);
    if (open == false) {
      col = GetStyleColorVec4(1);
      PushStyleColor(0,col);
    }
    pcVar7 = " *Inactive*";
    if ((open & 1U) != 0) {
      pcVar7 = "";
    }
    local_41 = TreeNodeEx(&g->Initialized,local_40,"%s \'%s\'%s",g,*(undefined8 *)label_local,pcVar7
                         );
    if ((open & 1U) == 0) {
      PopStyleColor(1);
    }
    bVar1 = IsItemHovered(0);
    if ((bVar1) && ((open & 1U) != 0)) {
      pIVar3 = GetForegroundDrawList((ImGuiWindow *)label_local);
      lhs = (ImVec2 *)(label_local + 0x18);
      _layer = operator+(lhs,(ImVec2 *)(label_local + 0x20));
      ImDrawList::AddRect(pIVar3,lhs,(ImVec2 *)&layer,0xff00ffff,0.0,0,1.0);
    }
    if ((local_41 & 1) != 0) {
      if ((label_local[0x3b8] & 1U) != 0) {
        TextDisabled("Note: some memory buffers have been compacted/freed.");
      }
      r.Max.y = *(float *)(label_local + 0xc);
      DebugNodeDrawList((ImGuiWindow *)label_local,*(ImDrawList **)(label_local + 0x280),"DrawList")
      ;
      BulletText("Pos: (%.1f,%.1f), Size: (%.1f,%.1f), ContentSize (%.1f,%.1f) Ideal (%.1f,%.1f)",
                 (double)*(float *)(label_local + 0x18),(double)*(float *)(label_local + 0x1c),
                 (double)*(float *)(label_local + 0x20),(double)*(float *)(label_local + 0x24),
                 (double)*(float *)(label_local + 0x30),(double)*(float *)(label_local + 0x34),
                 (double)*(float *)(label_local + 0x38),(double)*(float *)(label_local + 0x3c));
      pcVar7 = "";
      if (((uint)r.Max.y & 0x1000000) != 0) {
        pcVar7 = "Child ";
      }
      pcVar4 = "";
      if (((uint)r.Max.y & 0x2000000) != 0) {
        pcVar4 = "Tooltip ";
      }
      pcVar6 = "";
      if (((uint)r.Max.y & 0x4000000) != 0) {
        pcVar6 = "Popup ";
      }
      pcVar8 = "";
      if (((uint)r.Max.y & 0x8000000) != 0) {
        pcVar8 = "Modal ";
      }
      pcVar11 = "";
      if (((uint)r.Max.y & 0x10000000) != 0) {
        pcVar11 = "ChildMenu ";
      }
      pcVar5 = "";
      if (((uint)r.Max.y & 0x100) != 0) {
        pcVar5 = "NoSavedSettings ";
      }
      pcVar10 = "";
      if (((uint)r.Max.y & 0x200) != 0) {
        pcVar10 = "NoMouseInputs";
      }
      pcVar9 = "";
      if (((uint)r.Max.y & 0x40000) != 0) {
        pcVar9 = "NoNavInputs";
      }
      pcVar2 = "";
      if (((uint)r.Max.y & 0x40) != 0) {
        pcVar2 = "AlwaysAutoResize";
      }
      BulletText("Flags: 0x%08X (%s%s%s%s%s%s%s%s%s..)",(ulong)(uint)r.Max.y,pcVar7,pcVar4,pcVar6,
                 pcVar8,pcVar11,pcVar5,pcVar10,pcVar9,pcVar2);
      pcVar7 = "";
      if ((label_local[0x94] & 1U) != 0) {
        pcVar7 = "X";
      }
      pcVar4 = "";
      if ((label_local[0x95] & 1U) != 0) {
        pcVar4 = "Y";
      }
      BulletText("Scroll: (%.2f/%.2f,%.2f/%.2f) Scrollbar:%s%s",
                 (double)*(float *)(label_local + 100),(double)*(float *)(label_local + 0x6c),
                 (double)*(float *)(label_local + 0x68),(double)*(float *)(label_local + 0x70),
                 pcVar7,pcVar4);
      if (((label_local[0x96] & 1U) == 0) && ((label_local[0x97] & 1U) == 0)) {
        local_98 = 0xffffffff;
      }
      else {
        local_98 = (uint)*(short *)(label_local + 0xa6);
      }
      BulletText("Active: %d/%d, WriteAccessed: %d, BeginOrderWithinContext: %d",
                 (ulong)(label_local[0x96] & 1),(ulong)(label_local[0x97] & 1),
                 (ulong)(label_local[0x98] & 1),(ulong)local_98);
      BulletText("Appearing: %d, Hidden: %d (CanSkip %d Cannot %d), SkipItems: %d",
                 (ulong)(label_local[0x9c] & 1),(ulong)(label_local[0x9d] & 1),
                 (ulong)(uint)(int)label_local[0xb8],(ulong)(uint)(int)label_local[0xb9],
                 (ulong)(label_local[0x9b] & 1),pcVar11,pcVar5,pcVar10,pcVar9,pcVar2);
      for (r.Max.x = 0.0; (int)r.Max.x < 2; r.Max.x = (float)((int)r.Max.x + 1)) {
        local_64 = *(ImVec2 *)(label_local + (long)(int)r.Max.x * 0x10 + 0x390);
        r.Min = ((ImVec2 *)(label_local + (long)(int)r.Max.x * 0x10 + 0x390))[1];
        if ((local_64.x < r.Min.y) || (local_64.y < r.Min.y)) {
          BulletText("NavLastIds[%d]: 0x%08X at +(%.1f,%.1f)(%.1f,%.1f)",(double)local_64.x,
                     (double)local_64.y,(double)r.Min.x,(double)r.Min.y,(ulong)(uint)r.Max.x,
                     (ulong)*(uint *)(label_local + (long)(int)r.Max.x * 4 + 0x388));
          bVar1 = IsItemHovered(0);
          if (bVar1) {
            pIVar3 = GetForegroundDrawList((ImGuiWindow *)label_local);
            local_6c = operator+(&local_64,(ImVec2 *)(label_local + 0x18));
            IStack_74 = operator+(&r.Min,(ImVec2 *)(label_local + 0x18));
            ImDrawList::AddRect(pIVar3,&local_6c,&stack0xffffffffffffff8c,0xff00ffff,0.0,0,1.0);
          }
        }
        else {
          BulletText("NavLastIds[%d]: 0x%08X",(ulong)(uint)r.Max.x,
                     (ulong)*(uint *)(label_local + (long)(int)r.Max.x * 4 + 0x388));
        }
      }
      if (*(long *)(label_local + 0x380) == 0) {
        local_b0 = "NULL";
      }
      else {
        local_b0 = (char *)**(undefined8 **)(label_local + 0x380);
      }
      BulletText("NavLayersActiveMask: %X, NavLastChildNavWindow: %s",
                 (ulong)(uint)(int)*(short *)(label_local + 0x13c),local_b0);
      if (*(char **)(label_local + 0x360) != label_local) {
        DebugNodeWindow(*(ImGuiWindow **)(label_local + 0x360),"RootWindow");
      }
      if (*(long *)(label_local + 0x350) != 0) {
        DebugNodeWindow(*(ImGuiWindow **)(label_local + 0x350),"ParentWindow");
      }
      if (0 < *(int *)(label_local + 0x178)) {
        DebugNodeWindowsList((ImVector<ImGuiWindow_*> *)(label_local + 0x178),"ChildWindows");
      }
      if ((0 < *(int *)(label_local + 0x268)) &&
         (bVar1 = TreeNode("Columns","Columns sets (%d)",(ulong)*(uint *)(label_local + 0x268)),
         bVar1)) {
        for (local_78 = 0; local_78 < *(int *)(label_local + 0x268); local_78 = local_78 + 1) {
          columns = ImVector<ImGuiOldColumns>::operator[]
                              ((ImVector<ImGuiOldColumns> *)(label_local + 0x268),local_78);
          DebugNodeColumns(columns);
        }
        TreePop();
      }
      DebugNodeStorage((ImGuiStorage *)(label_local + 600),"Storage");
      TreePop();
    }
  }
  return;
}

Assistant:

void ImGui::DebugNodeWindow(ImGuiWindow* window, const char* label)
{
    if (window == NULL)
    {
        BulletText("%s: NULL", label);
        return;
    }

    ImGuiContext& g = *GImGui;
    const bool is_active = window->WasActive;
    ImGuiTreeNodeFlags tree_node_flags = (window == g.NavWindow) ? ImGuiTreeNodeFlags_Selected : ImGuiTreeNodeFlags_None;
    if (!is_active) { PushStyleColor(ImGuiCol_Text, GetStyleColorVec4(ImGuiCol_TextDisabled)); }
    const bool open = TreeNodeEx(label, tree_node_flags, "%s '%s'%s", label, window->Name, is_active ? "" : " *Inactive*");
    if (!is_active) { PopStyleColor(); }
    if (IsItemHovered() && is_active)
        GetForegroundDrawList(window)->AddRect(window->Pos, window->Pos + window->Size, IM_COL32(255, 255, 0, 255));
    if (!open)
        return;

    if (window->MemoryCompacted)
        TextDisabled("Note: some memory buffers have been compacted/freed.");

    ImGuiWindowFlags flags = window->Flags;
    DebugNodeDrawList(window, window->DrawList, "DrawList");
    BulletText("Pos: (%.1f,%.1f), Size: (%.1f,%.1f), ContentSize (%.1f,%.1f) Ideal (%.1f,%.1f)", window->Pos.x, window->Pos.y, window->Size.x, window->Size.y, window->ContentSize.x, window->ContentSize.y, window->ContentSizeIdeal.x, window->ContentSizeIdeal.y);
    BulletText("Flags: 0x%08X (%s%s%s%s%s%s%s%s%s..)", flags,
        (flags & ImGuiWindowFlags_ChildWindow)  ? "Child " : "",      (flags & ImGuiWindowFlags_Tooltip)     ? "Tooltip "   : "",  (flags & ImGuiWindowFlags_Popup) ? "Popup " : "",
        (flags & ImGuiWindowFlags_Modal)        ? "Modal " : "",      (flags & ImGuiWindowFlags_ChildMenu)   ? "ChildMenu " : "",  (flags & ImGuiWindowFlags_NoSavedSettings) ? "NoSavedSettings " : "",
        (flags & ImGuiWindowFlags_NoMouseInputs)? "NoMouseInputs":"", (flags & ImGuiWindowFlags_NoNavInputs) ? "NoNavInputs" : "", (flags & ImGuiWindowFlags_AlwaysAutoResize) ? "AlwaysAutoResize" : "");
    BulletText("Scroll: (%.2f/%.2f,%.2f/%.2f) Scrollbar:%s%s", window->Scroll.x, window->ScrollMax.x, window->Scroll.y, window->ScrollMax.y, window->ScrollbarX ? "X" : "", window->ScrollbarY ? "Y" : "");
    BulletText("Active: %d/%d, WriteAccessed: %d, BeginOrderWithinContext: %d", window->Active, window->WasActive, window->WriteAccessed, (window->Active || window->WasActive) ? window->BeginOrderWithinContext : -1);
    BulletText("Appearing: %d, Hidden: %d (CanSkip %d Cannot %d), SkipItems: %d", window->Appearing, window->Hidden, window->HiddenFramesCanSkipItems, window->HiddenFramesCannotSkipItems, window->SkipItems);
    for (int layer = 0; layer < ImGuiNavLayer_COUNT; layer++)
    {
        ImRect r = window->NavRectRel[layer];
        if (r.Min.x >= r.Max.y && r.Min.y >= r.Max.y)
        {
            BulletText("NavLastIds[%d]: 0x%08X", layer, window->NavLastIds[layer]);
            continue;
        }
        BulletText("NavLastIds[%d]: 0x%08X at +(%.1f,%.1f)(%.1f,%.1f)", layer, window->NavLastIds[layer], r.Min.x, r.Min.y, r.Max.x, r.Max.y);
        if (IsItemHovered())
            GetForegroundDrawList(window)->AddRect(r.Min + window->Pos, r.Max + window->Pos, IM_COL32(255, 255, 0, 255));
    }
    BulletText("NavLayersActiveMask: %X, NavLastChildNavWindow: %s", window->DC.NavLayersActiveMask, window->NavLastChildNavWindow ? window->NavLastChildNavWindow->Name : "NULL");
    if (window->RootWindow != window)       { DebugNodeWindow(window->RootWindow, "RootWindow"); }
    if (window->ParentWindow != NULL)       { DebugNodeWindow(window->ParentWindow, "ParentWindow"); }
    if (window->DC.ChildWindows.Size > 0)   { DebugNodeWindowsList(&window->DC.ChildWindows, "ChildWindows"); }
    if (window->ColumnsStorage.Size > 0 && TreeNode("Columns", "Columns sets (%d)", window->ColumnsStorage.Size))
    {
        for (int n = 0; n < window->ColumnsStorage.Size; n++)
            DebugNodeColumns(&window->ColumnsStorage[n]);
        TreePop();
    }
    DebugNodeStorage(&window->StateStorage, "Storage");
    TreePop();
}